

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O0

bool __thiscall
phyr::RenderConfig::getConfigArgs(RenderConfig *this,string *key,ConfigArgsList *args)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type sVar3;
  long in_RDX;
  UnsupportedConfigException *unaff_retaddr;
  key_type *in_stack_ffffffffffffffb8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
  *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
          ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
                   *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (sVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x48);
    UnsupportedConfigException::UnsupportedConfigException
              (unaff_retaddr,(string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
              );
    __cxa_throw(uVar2,&UnsupportedConfigException::typeinfo,
                UnsupportedConfigException::~UnsupportedConfigException);
  }
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
          ::count(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (sVar3 == 0) {
    bVar4 = false;
  }
  else {
    if (in_RDX != 0) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
      ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      ConfigArgsList::operator=
                ((ConfigArgsList *)in_stack_ffffffffffffffc0,
                 (ConfigArgsList *)in_stack_ffffffffffffffb8);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool getConfigArgs(const std::string& key, ConfigArgsList* args = nullptr) {
        if (SupportedConfigMap.count(key) == 0)
            throw UnsupportedConfigException(key);

        if (configMap.count(key) == 0)
            return false;
        else if (args)
            *args = configMap[key];
        return true;
    }